

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

ImfInputFile * ImfOpenInputFile(char *name)

{
  int numThreads;
  RgbaInputFile *this;
  
  this = (RgbaInputFile *)operator_new(0x40);
  numThreads = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(this,name,numThreads);
  return (ImfInputFile *)this;
}

Assistant:

ImfInputFile*
ImfOpenInputFile (const char name[])
{
    try
    {
        return (ImfInputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            RgbaInputFile (name);
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}